

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O3

void __thiscall ft::deque<int,_ft::allocator<int>_>::clear(deque<int,_ft::allocator<int>_> *this)

{
  pointer pvVar1;
  size_type sVar2;
  pointer pvVar3;
  map_pointer ppvVar4;
  map_pointer ppvVar5;
  pointer pvVar6;
  
  sVar2 = this->m_size;
  if (sVar2 == 0) {
    pvVar1 = (this->m_finish).m_cur;
  }
  else {
    pvVar1 = (this->m_finish).m_cur;
    pvVar3 = (this->m_finish).m_first;
    ppvVar4 = (this->m_finish).m_node;
    do {
      ppvVar5 = ppvVar4;
      if (pvVar1 == pvVar3) {
        ppvVar5 = ppvVar4 + -1;
        (this->m_finish).m_node = ppvVar5;
        pvVar3 = ppvVar4[-1];
        (this->m_finish).m_first = pvVar3;
        pvVar1 = pvVar3 + 0x40;
        (this->m_finish).m_last = pvVar1;
      }
      pvVar1 = pvVar1 + -1;
      (this->m_finish).m_cur = pvVar1;
      sVar2 = sVar2 - 1;
      ppvVar4 = ppvVar5;
    } while (sVar2 != 0);
    this->m_size = 0;
  }
  pvVar3 = (this->m_start).m_cur;
  if (pvVar3 != pvVar1) {
    pvVar6 = (this->m_start).m_last;
    sVar2 = 0;
    ppvVar4 = (this->m_start).m_node;
    do {
      pvVar3 = pvVar3 + 1;
      (this->m_start).m_cur = pvVar3;
      ppvVar5 = ppvVar4;
      if (pvVar3 == pvVar6) {
        ppvVar5 = ppvVar4 + 1;
        (this->m_start).m_node = ppvVar5;
        pvVar3 = ppvVar4[1];
        (this->m_start).m_first = pvVar3;
        pvVar6 = pvVar3 + 0x40;
        (this->m_start).m_last = pvVar6;
        (this->m_start).m_cur = pvVar3;
      }
      sVar2 = sVar2 - 1;
      ppvVar4 = ppvVar5;
    } while (pvVar3 != pvVar1);
    this->m_size = sVar2;
  }
  return;
}

Assistant:

void clear() {
		size_type n = this->size();
		while (n > this->size() / 2) {
			this->pop_back();
			--n;
		}

		while (this->begin() != this->end())
			this->pop_front();
	}